

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O2

int __thiscall QProgressDialogPrivate::init(QProgressDialogPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *parent;
  Alignment alignment;
  QLabel *this_00;
  QProgressBar *this_01;
  QStyle *pQVar1;
  QTimer *this_02;
  int in_ECX;
  QString *in_RDX;
  int in_R8D;
  long in_FS_OFFSET;
  QObject local_48 [8];
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  parent = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  this_00 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(this_00,(QString *)ctx,parent,(WindowFlags)0x0);
  this->label = this_00;
  this_01 = (QProgressBar *)operator_new(0x28);
  QProgressBar::QProgressBar(this_01,parent);
  this->bar = this_01;
  QProgressBar::setRange(this_01,in_ECX,in_R8D);
  pQVar1 = QWidget::style(parent);
  alignment.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i
       = (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
         (**(code **)(*(long *)pQVar1 + 0xf0))(pQVar1,10,0,parent,0);
  QLabel::setAlignment(this->label,alignment);
  QObject::connect(local_40,(char *)parent,(QObject *)"2canceled()",(char *)parent,0x66df42);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  this_02 = (QTimer *)operator_new(0x10);
  QTimer::QTimer(this_02,&parent->super_QObject);
  this->forceTimer = this_02;
  QObject::connect(local_48,(char *)this_02,(QObject *)"2timeout()",(char *)parent,0x66df57);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  if (this->useDefaultCancelText == true) {
    retranslateStrings(this);
  }
  else {
    QProgressDialog::setCancelButtonText((QProgressDialog *)parent,in_RDX);
  }
  QElapsedTimer::start();
  QTimer::start(this->forceTimer,(this->showTime).__r);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QProgressDialogPrivate::init(const QString &labelText, const QString &cancelText,
                                  int min, int max)
{
    Q_Q(QProgressDialog);
    label = new QLabel(labelText, q);
    bar = new QProgressBar(q);
    bar->setRange(min, max);
    int align = q->style()->styleHint(QStyle::SH_ProgressDialog_TextLabelAlignment, nullptr, q);
    label->setAlignment(Qt::Alignment(align));
    QObject::connect(q, SIGNAL(canceled()), q, SLOT(cancel()));
    forceTimer = new QTimer(q);
    QObject::connect(forceTimer, SIGNAL(timeout()), q, SLOT(forceShow()));
    if (useDefaultCancelText) {
        retranslateStrings();
    } else {
        q->setCancelButtonText(cancelText);
    }
    starttime.start();
    forceTimer->start(showTime);
}